

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::MILSpec::Operation::_InternalParse
          (Operation *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  string *s;
  NamedValueType *msg;
  Block *msg_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar2;
  uint32_t tag;
  char *local_50;
  uint local_44;
  InternalMetadata *local_40;
  Operation *local_38;
  
  local_40 = &(this->super_MessageLite)._internal_metadata_;
  local_50 = ptr;
  local_38 = this;
LAB_001a9629:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_50);
    if (bVar1) {
      return local_50;
    }
    local_50 = google::protobuf::internal::ReadTag(local_50,&local_44,0);
    tag_00 = local_44;
    cVar2 = (char)local_44;
    switch(local_44 >> 3) {
    case 1:
      if (cVar2 != '\n') break;
      s = _internal_mutable_type_abi_cxx11_(local_38);
      local_50 = google::protobuf::internal::InlineGreedyStringParser(s,local_50,ctx);
      bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
      if (!bVar1) {
        return (char *)0x0;
      }
      goto joined_r0x001a96be;
    case 2:
      if (cVar2 == '\x12') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          local_50 = google::protobuf::internal::ParseContext::
                     ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                               (ctx,&this->inputs_,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\x12'));
        goto LAB_001a9629;
      }
      break;
    case 3:
      if (cVar2 == '\x1a') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg = google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::
                Add(&this->outputs_);
          local_50 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\x1a'));
        goto LAB_001a9629;
      }
      break;
    case 4:
      if (cVar2 == '\"') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          msg_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::Add
                             (&this->blocks_);
          local_50 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg_00->super_MessageLite,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '\"'));
        goto LAB_001a9629;
      }
      break;
    case 5:
      if (cVar2 == '*') {
        local_50 = local_50 + -1;
        do {
          local_50 = local_50 + 1;
          local_50 = google::protobuf::internal::ParseContext::
                     ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                               (ctx,&this->attributes_,local_50);
          if (local_50 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_50 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_50 == '*'));
        goto LAB_001a9629;
      }
    }
    if ((local_44 == 0) || ((local_44 & 7) == 4)) {
      if (local_50 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_44 - 1;
      return local_50;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_40);
    local_50 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_50,ctx);
joined_r0x001a96be:
    if (local_50 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Operation::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string type = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_type();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(&inputs_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_outputs(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_blocks(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(&attributes_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}